

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathNewValueTree(xmlNodePtr val)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  
  pxVar1 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating result value tree\n");
  }
  else {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->nodesetval = (xmlNodeSetPtr)0x0;
    *(undefined8 *)&pxVar1->boolval = 0;
    pxVar1->floatval = 0.0;
    pxVar1->stringval = (xmlChar *)0x0;
    pxVar1->user = (void *)0x0;
    *(undefined8 *)&pxVar1->index = 0;
    pxVar1->user2 = (void *)0x0;
    *(undefined8 *)&pxVar1->index2 = 0;
    pxVar1->type = XPATH_XSLT_TREE;
    pxVar1->boolval = 1;
    pxVar1->user = val;
    pxVar2 = xmlXPathNodeSetCreate(val);
    pxVar1->nodesetval = pxVar2;
  }
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewValueTree(xmlNodePtr val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating result value tree\n");
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_XSLT_TREE;
    ret->boolval = 1;
    ret->user = (void *) val;
    ret->nodesetval = xmlXPathNodeSetCreate(val);
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_XSLT_TREE);
#endif
    return(ret);
}